

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void __thiscall
andres::Marray<int,std::allocator<unsigned_long>>::
Marray<andres::BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<int,false,std::allocator<unsigned_long>>,int,andres::marray_detail::Times<int,int,int>>,int>
          (Marray<int,std::allocator<unsigned_long>> *this,
          ViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int>
          *expression,allocator_type *allocator)

{
  CoordinateOrder CVar1;
  View<int,_false,_std::allocator<unsigned_long>_> *pVVar2;
  View<int,_false,_std::allocator<unsigned_long>_> *this_00;
  value_type vVar3;
  int *piVar4;
  size_t sVar5;
  size_t *end;
  unsigned_long *puVar6;
  runtime_error *this_01;
  ulong uVar7;
  ulong uVar8;
  allocator_type local_71;
  size_t *local_70;
  Geometry<std::allocator<unsigned_long>> local_68 [8];
  void *local_60;
  long local_48;
  undefined8 local_40;
  undefined4 local_38;
  Marray<int,std::allocator<unsigned_long>> local_34;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined4 *)(this + 0x38) = 1;
  this[0x3c] = (Marray<int,std::allocator<unsigned_long>>)0x1;
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  uVar8 = *(ulong *)(*(long *)(expression + 8) + 0x30);
  if (*(ulong *)(*(long *)(expression + 8) + 0x30) < *(ulong *)(*(long *)expression + 0x30)) {
    uVar8 = *(ulong *)(*(long *)expression + 0x30);
  }
  piVar4 = __gnu_cxx::new_allocator<int>::allocate
                     ((new_allocator<int> *)(this + 0x40),uVar8,(void *)0x0);
  *(int **)this = piVar4;
  sVar5 = BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
          ::dimension((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                       *)expression);
  if (sVar5 == 0) {
    pVVar2 = *(View<int,_false,_std::allocator<unsigned_long>_> **)expression;
    View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(pVVar2);
    local_60 = operator_new(0);
    CVar1 = (pVVar2->geometry_).coordinateOrder_;
    if (*(long *)(this + 0x28) != 0) {
      operator_delete(*(void **)(this + 0x10),*(long *)(this + 0x28) * 0x18);
      *(undefined8 *)(this + 0x28) = 0;
      puVar6 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                         ((new_allocator<unsigned_long> *)(this + 8),0,(void *)0x0);
      *(unsigned_long **)(this + 0x10) = puVar6;
      *(unsigned_long **)(this + 0x18) = puVar6 + *(long *)(this + 0x28);
      *(unsigned_long **)(this + 0x20) = puVar6 + *(long *)(this + 0x28) + *(long *)(this + 0x28);
      *(undefined8 *)(this + 0x28) = 0;
    }
    *(undefined8 *)(this + 0x30) = 1;
    *(CoordinateOrder *)(this + 0x38) = CVar1;
    this[0x3c] = (Marray<int,std::allocator<unsigned_long>>)0x1;
    uVar8 = 0;
  }
  else {
    local_70 = BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
               ::shapeBegin((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                             *)expression);
    end = BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
          ::shapeEnd((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                      *)expression);
    pVVar2 = *(View<int,_false,_std::allocator<unsigned_long>_> **)expression;
    View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(pVVar2);
    this_00 = *(View<int,_false,_std::allocator<unsigned_long>_> **)expression;
    View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(this_00);
    marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long_const*>
              (local_68,local_70,end,&(pVVar2->geometry_).coordinateOrder_,
               &(this_00->geometry_).coordinateOrder_,&local_71);
    if (local_68 != (Geometry<std::allocator<unsigned_long>> *)(this + 8)) {
      puVar6 = *(unsigned_long **)(this + 0x10);
      if (local_48 != *(long *)(this + 0x28)) {
        operator_delete(puVar6,*(long *)(this + 0x28) * 0x18);
        *(long *)(this + 0x28) = local_48;
        puVar6 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                           ((new_allocator<unsigned_long> *)(this + 8),local_48 * 3,(void *)0x0);
        *(unsigned_long **)(this + 0x10) = puVar6;
        *(unsigned_long **)(this + 0x18) = puVar6 + *(long *)(this + 0x28);
        *(unsigned_long **)(this + 0x20) = puVar6 + *(long *)(this + 0x28) + *(long *)(this + 0x28);
        *(long *)(this + 0x28) = local_48;
      }
      memcpy(puVar6,local_60,local_48 * 0x18);
      *(undefined8 *)(this + 0x30) = local_40;
      *(undefined4 *)(this + 0x38) = local_38;
      this[0x3c] = local_34;
    }
    uVar8 = local_48 * 0x18;
  }
  operator_delete(local_60,uVar8);
  sVar5 = BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
          ::dimension((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                       *)expression);
  uVar8 = *(ulong *)(*(long *)expression + 0x30);
  uVar7 = *(ulong *)(*(long *)(expression + 8) + 0x30);
  if (sVar5 == 0) {
    if (uVar7 < uVar8) {
      uVar7 = uVar8;
    }
    if (1 < uVar7) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"Assertion failed.");
      goto LAB_0021c524;
    }
    vVar3 = BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<int,false,std::allocator<unsigned_long>>,int,andres::marray_detail::Times<int,int,int>>
            ::operator()((BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<int,false,std::allocator<unsigned_long>>,int,andres::marray_detail::Times<int,int,int>>
                          *)expression,0);
    **(value_type **)this = vVar3;
  }
  else {
    if (uVar7 == 0 && uVar8 == 0) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"Assertion failed.");
      goto LAB_0021c524;
    }
    marray_detail::
    operate<andres::marray_detail::Assign<int,int>,int,std::allocator<unsigned_long>,andres::BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<int,false,std::allocator<unsigned_long>>,int,andres::marray_detail::Times<int,int,int>>,int>
              (this,expression);
  }
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  if (this[0x3c] != (Marray<int,std::allocator<unsigned_long>>)0x0) {
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Assertion failed.");
LAB_0021c524:
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
Marray<T, A>::Marray
(
    const ViewExpression<E, Te>& expression,
    const allocator_type& allocator
) 
:   dataAllocator_(allocator)
{
    this->data_ = dataAllocator_.allocate(expression.size());
    if(expression.dimension() == 0) {
        this->geometry_ = geometry_type(0, 
            static_cast<const E&>(expression).coordinateOrder(), 
            1, true, dataAllocator_);
    }
    else {
        this->geometry_ = geometry_type(
            static_cast<const E&>(expression).shapeBegin(), 
            static_cast<const E&>(expression).shapeEnd(),
            static_cast<const E&>(expression).coordinateOrder(),
            static_cast<const E&>(expression).coordinateOrder(),
            dataAllocator_);

    }
    const E& e = static_cast<const E&>(expression);
    if(e.dimension() == 0) {
        marray_detail::Assert(MARRAY_NO_ARG_TEST || e.size() < 2);
        this->data_[0] = static_cast<T>(e(0));
    }
    else {
        marray_detail::Assert(MARRAY_NO_ARG_TEST || e.size() != 0);
        marray_detail::operate(*this, e, marray_detail::Assign<T, Te>());
    }
    testInvariant();
}